

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testAttrStrings(string *tempdir)

{
  exr_context_t f_00;
  exr_context_t f;
  
  f_00 = createDummyFile("<string>");
  f = f_00;
  testStringHelper(f_00);
  exr_print_context_info(f_00,0);
  exr_print_context_info(f_00,1);
  exr_finish(&f);
  return;
}

Assistant:

void
testAttrStrings (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testStringHelper (NULL);
    exr_context_t f = createDummyFile ("<string>");
    testStringHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}